

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::InfoParser::InfoParser(InfoParser *this,cmCTestBZR *bzr,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__InfoParser_00684a90;
  this->BZR = bzr;
  this->CheckOutFound = false;
  (this->RegexCheckOut).program = (char *)0x0;
  (this->RegexParent).program = (char *)0x0;
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexCheckOut,"checkout of branch: *([^\t\r\n]+)$");
  cmsys::RegularExpression::compile(&this->RegexParent,"parent branch: *([^\t\r\n]+)$");
  return;
}

Assistant:

InfoParser(cmCTestBZR* bzr, const char* prefix):
    BZR(bzr), CheckOutFound(false)
    {
    this->SetLog(&bzr->Log, prefix);
    this->RegexCheckOut.compile("checkout of branch: *([^\t\r\n]+)$");
    this->RegexParent.compile("parent branch: *([^\t\r\n]+)$");
    }